

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O2

int Dar_BalanceFindLeft(Vec_Ptr_t *vSuper)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = vSuper->nSize;
  iVar5 = 0;
  if (2 < iVar6) {
    pvVar3 = Vec_PtrEntry(vSuper,iVar6 + -2);
    for (iVar6 = iVar6 + -3; iVar5 = -1, -1 < iVar6; iVar6 = iVar6 + -1) {
      pvVar4 = Vec_PtrEntry(vSuper,iVar6);
      iVar1 = Aig_ObjLevel((Aig_Obj_t *)((ulong)pvVar4 & 0xfffffffffffffffe));
      iVar2 = Aig_ObjLevel((Aig_Obj_t *)((ulong)pvVar3 & 0xfffffffffffffffe));
      iVar5 = iVar6;
      if (iVar1 != iVar2) break;
    }
    iVar5 = iVar5 + 1;
    pvVar4 = Vec_PtrEntry(vSuper,iVar5);
    iVar6 = Aig_ObjLevel((Aig_Obj_t *)((ulong)pvVar4 & 0xfffffffffffffffe));
    iVar1 = Aig_ObjLevel((Aig_Obj_t *)((ulong)pvVar3 & 0xfffffffffffffffe));
    if (iVar6 != iVar1) {
      __assert_fail("Aig_ObjLevel(Aig_Regular(pObjLeft)) == Aig_ObjLevel(Aig_Regular(pObjRight))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darBalance.c"
                    ,0x102,"int Dar_BalanceFindLeft(Vec_Ptr_t *)");
    }
  }
  return iVar5;
}

Assistant:

int Dar_BalanceFindLeft( Vec_Ptr_t * vSuper )
{
    Aig_Obj_t * pObjRight, * pObjLeft;
    int Current;
    // if two or less nodes, pair with the first
    if ( Vec_PtrSize(vSuper) < 3 )
        return 0;
    // set the pointer to the one before the last
    Current = Vec_PtrSize(vSuper) - 2;
    pObjRight = (Aig_Obj_t *)Vec_PtrEntry( vSuper, Current );
    // go through the nodes to the left of this one
    for ( Current--; Current >= 0; Current-- )
    {
        // get the next node on the left
        pObjLeft = (Aig_Obj_t *)Vec_PtrEntry( vSuper, Current );
        // if the level of this node is different, quit the loop
        if ( Aig_ObjLevel(Aig_Regular(pObjLeft)) != Aig_ObjLevel(Aig_Regular(pObjRight)) )
            break;
    }
    Current++;    
    // get the node, for which the equality holds
    pObjLeft = (Aig_Obj_t *)Vec_PtrEntry( vSuper, Current );
    assert( Aig_ObjLevel(Aig_Regular(pObjLeft)) == Aig_ObjLevel(Aig_Regular(pObjRight)) );
    return Current;
}